

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::type_caster<double,_void>::load
          (type_caster<double,_void> *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  handle src_00;
  object tmp;
  object local_30;
  double local_28;
  
  if ((src.m_ptr != (PyObject *)0x0) &&
     ((convert || (iVar2 = _PyObject_TypeCheck(src.m_ptr,(PyTypeObject *)&PyFloat_Type), iVar2 != 0)
      ))) {
    local_28 = (double)PyFloat_AsDouble(src.m_ptr);
    if ((local_28 != -1.0) || ((NAN(local_28) || (lVar3 = PyErr_Occurred(), lVar3 == 0)))) {
      this->value = local_28;
      return true;
    }
    iVar2 = PyErr_ExceptionMatches(_PyExc_TypeError);
    PyErr_Clear();
    if ((convert && iVar2 != 0) && (iVar2 = PyNumber_Check(src.m_ptr), iVar2 != 0)) {
      src_00.m_ptr = (PyObject *)PyNumber_Float(src.m_ptr);
      if (src_00.m_ptr != (PyObject *)0x0) {
        (src_00.m_ptr)->ob_refcnt = (src_00.m_ptr)->ob_refcnt + 1;
      }
      local_30.super_handle.m_ptr = (handle)(handle)src_00.m_ptr;
      PyErr_Clear();
      bVar1 = load(this,src_00,false);
      pybind11::object::~object(&local_30);
      return bVar1;
    }
  }
  return false;
}

Assistant:

PYBIND11_NOINLINE inline handle get_object_handle(const void *ptr, const detail::type_info *type ) {
    auto &instances = get_internals().registered_instances;
    auto range = instances.equal_range(ptr);
    for (auto it = range.first; it != range.second; ++it) {
        auto instance_type = detail::get_type_info(Py_TYPE(it->second));
        if (instance_type && instance_type == type)
            return handle((PyObject *) it->second);
    }
    return handle();
}